

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9edf6::FilterKernel<4U>::FilterKernel(FilterKernel<4U> *this,float multiplier_)

{
  long lVar1;
  int iVar2;
  uint8_t uVar3;
  int iVar4;
  FilterKernel<4U> *pFVar5;
  uint8_t (*pauVar6) [1024];
  long lVar7;
  uint32_t i;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 in_register_00001304 [12];
  undefined1 extraout_var [60];
  
  pFVar5 = &Image_Function::Sobel::kernel;
  lVar8 = 0;
  do {
    iVar2 = (int)lVar8;
    lVar7 = 0;
    pauVar6 = (uint8_t (*) [1024])pFVar5;
    do {
      iVar4 = iVar2 + (int)lVar7;
      auVar9._0_4_ = (float)(iVar4 * iVar4 + iVar2 * iVar2);
      auVar9._4_12_ = in_register_00001304;
      if (auVar9._0_4_ < 0.0) {
        auVar10._0_4_ = sqrtf(auVar9._0_4_);
        auVar10._4_60_ = extraout_var;
        auVar9 = auVar10._0_16_;
      }
      else {
        auVar9 = vsqrtss_avx(auVar9,auVar9);
      }
      auVar9 = vfmadd213ss_fma(auVar9,SUB6416(ZEXT464(0x3e3504f3),0),SUB6416(ZEXT464(0x3f000000),0))
      ;
      uVar3 = (uint8_t)(int)auVar9._0_4_;
      (*(uint8_t (*) [1024])*pauVar6)[0] = uVar3;
      (*(uint8_t (*) [1024])pFVar5)[lVar7] = uVar3;
      pauVar6 = pauVar6 + 1;
      lVar1 = lVar8 + 1 + lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar1 != 0x400);
    lVar8 = lVar8 + 1;
    pFVar5 = (FilterKernel<4U> *)(*(uint8_t (*) [1024])((long)pFVar5 + 0x400) + 1);
  } while (lVar8 != 0x400);
  return;
}

Assistant:

explicit FilterKernel(float multiplier_)
        {
            const uint32_t size = 256u * sizeInBytes;
            for ( uint32_t i = 0; i < size; ++i ) {
                for ( uint32_t j = i; j < size; ++j )
                    kernel[i][j] = kernel[j][i] = static_cast<uint8_t>(sqrtf( static_cast<float>(i * i + j * j) ) * multiplier_ + 0.5f);
            }
        }